

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

void new_parsed_str(vm_val_t *ret,char *str,size_t len,int encmode)

{
  char *buf;
  char cVar1;
  byte bVar2;
  byte bVar3;
  CVmObjPageEntry *pCVar4;
  vm_obj_id_t vVar5;
  uint uVar6;
  int iVar7;
  undefined2 *puVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  char *s1;
  uint16_t tmp;
  char *pcVar12;
  size_t len_00;
  
  vVar5 = CVmObjString::create(0,str,len);
  ret->typ = VM_OBJ;
  (ret->val).obj = vVar5;
  pCVar4 = G_obj_table_X.pages_[vVar5 >> 0xc];
  puVar8 = *(undefined2 **)((long)&pCVar4[vVar5 & 0xfff].ptr_ + 8);
  buf = (char *)(puVar8 + 1);
  pcVar10 = (char *)((long)puVar8 + len + 2);
  if (encmode - 1U < 2) {
    pcVar12 = buf;
    if (0 < (long)len) {
      pcVar11 = buf;
      do {
        cVar1 = *pcVar11;
        if (cVar1 == '\r') {
          if (encmode != 2) goto LAB_0020342f;
LAB_0020342a:
          s1 = pcVar11 + 1;
        }
        else {
          if (cVar1 == '+') {
            *pcVar12 = ' ';
            pcVar12 = pcVar12 + 1;
            goto LAB_0020342a;
          }
          if (cVar1 == '%') {
            if ((((((char *)((long)puVar8 + len) <= pcVar11) ||
                  (bVar2 = pcVar11[1], (char)bVar2 < '\0')) ||
                 (((int)(char)bVar2 - 0x3aU < 0xfffffff6 &&
                  ((0x25 < bVar2 - 0x41 ||
                   ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0)))))) ||
                (bVar3 = pcVar11[2], (char)bVar3 < '\0')) ||
               (((int)(char)bVar3 - 0x3aU < 0xfffffff6 &&
                ((0x25 < bVar3 - 0x41 ||
                 ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) == 0))))))
            goto LAB_0020342f;
            iVar7 = -0x37;
            iVar9 = -0x37;
            if (bVar2 < 0x41) {
              iVar9 = -0x30;
            }
            if (0x60 < bVar2) {
              iVar9 = -0x57;
            }
            if (bVar3 < 0x41) {
              iVar7 = -0x30;
            }
            if (0x60 < bVar3) {
              iVar7 = -0x57;
            }
            uVar6 = iVar7 + (char)bVar3 | (iVar9 + (char)bVar2) * 0x10;
            s1 = pcVar11 + 3;
            if ((uVar6 == 0xd) && (uVar6 = 0xd, pcVar11 + 5 < pcVar10)) {
              iVar7 = memicmp(s1,"%0a",3);
              if (iVar7 == 0) {
                s1 = pcVar11 + 6;
              }
              uVar6 = (uint)(iVar7 != 0) * 3 + 10;
            }
            *pcVar12 = (char)uVar6;
            pcVar12 = pcVar12 + 1;
          }
          else {
            if ((encmode == 2) && (cVar1 == '\n')) goto LAB_0020342a;
LAB_0020342f:
            s1 = pcVar11 + 1;
            *pcVar12 = cVar1;
            pcVar12 = pcVar12 + 1;
          }
        }
        pcVar11 = s1;
      } while (s1 < pcVar10);
      puVar8 = *(undefined2 **)((long)&pCVar4[vVar5 & 0xfff].ptr_ + 8);
    }
    len_00 = (long)pcVar12 - (long)buf;
    *puVar8 = (short)len_00;
  }
  else {
    len_00 = (long)pcVar10 - (long)buf;
  }
  CCharmapToUni::validate(buf,len_00);
  return;
}

Assistant:

static void new_parsed_str(VMG_ vm_val_t *ret, const char *str, size_t len,
                           int encmode)
{
    char *src, *dst;

    /* create the raw string */
    ret->set_obj(CVmObjString::create(vmg_ FALSE, str, len));
    CVmObjString *s = (CVmObjString *)vm_objp(vmg_ ret->val.obj);

    /* get the string buffer */
    char *buf = s->cons_get_buf();
    char *bufend = buf + len;

    /* 
     *   if desired, decode url-encoding: run through the string, converting
     *   '%xx' sequences to bytes, and '+' characters to spaces
     */
    if (encmode == ENCMODE_URL || encmode == ENCMODE_FORM)
    {
        for (src = dst = buf ; src < bufend ; )
        {
            /* if this is a '%xx' sequence, convert it */
            if (*src == '%' && src + 2 < bufend
                && is_xdigit(*(src+1)) && is_xdigit(*(src+2)))
            {
                /* generate the character value */
                int c = (value_of_xdigit(*(src+1)) << 4)
                        | value_of_xdigit(*(src+2));

                /* skip the three-character %xx sequence */
                src += 3;

                /* 
                 *   if this is an encoded CR, and an LF follows, decode the
                 *   whole sequence to a single '\n' 
                 */
                if (c == '\r'
                    && src + 2 < bufend
                    && memicmp(src, "%0a", 3) == 0)
                {
                    /* change to '\n' */
                    c = '\n';

                    /* skip the in the source */
                    src += 3;
                }
                
                /* set the character in the output */
                *dst++ = (char)(unsigned char)c;
            }
            else if (*src == '+'
                     && (encmode == ENCMODE_FORM || encmode == ENCMODE_URL))
            {
                /* for form data, translate + to space */
                *dst++ = ' ';
                ++src;
            }
            else if ((*src == '\r' || *src == '\n')
                     && encmode == ENCMODE_FORM)
            {
                /* for form data, strip out newlines */
                ++src;
            }
            else
            {
                /* ordinary character - copy as-is */
                *dst++ = *src++;
            }
        }
        
        /* 
         *   update the length - the string might have contracted, since
         *   '%xx' sequences might have turned into single bytes 
         */
        len = dst - buf;
        bufend = dst;
        s->cons_set_len(len);
    }
    else if (encmode == ENCMODE_MIME)
    {
        // $$$ decode the MIME ?= encoding
    }

    /* ensure that the buffer has only well-formed UTF-8 characters */
    CCharmapToUni::validate(buf, bufend - buf);
}